

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

UniValue * read_json(string_view jsondata)

{
  ulong uVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue v;
  UniValue *in_stack_ffffffffffffff28;
  UniValue *in_stack_ffffffffffffff30;
  UniValue *func;
  UniValue *this;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff64;
  bool *in_stack_ffffffffffffff68;
  UniValue local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_60;
  func = in_RDI;
  UniValue::UniValue(in_stack_ffffffffffffff28);
  uVar1 = UniValue::read(this,in_ESI,in_RDX,in_RCX);
  uVar2 = CONCAT13((char)uVar1,(int3)in_stack_ffffffffffffff60);
  if ((uVar1 & 1) != 0) {
    UniValue::isArray(in_stack_ffffffffffffff28);
  }
  inline_assertion_check<true,bool>
            (in_stack_ffffffffffffff68,(char *)CONCAT44(in_stack_ffffffffffffff64,uVar2),
             (int)((ulong)this >> 0x20),(char *)func,(char *)in_RDI);
  UniValue::get_array(in_stack_ffffffffffffff30);
  UniValue::UniValue(this,func);
  UniValue::~UniValue(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return func;
}

Assistant:

UniValue read_json(std::string_view jsondata)
{
    UniValue v;
    Assert(v.read(jsondata) && v.isArray());
    return v.get_array();
}